

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

uint32_t __thiscall cfd::Psbt::AddTxIn(Psbt *this,OutPoint *outpoint,uint32_t sequence)

{
  uint uVar1;
  uint32_t uVar2;
  Txid *in_RDI;
  undefined1 local_38 [56];
  
  cfd::core::OutPoint::GetTxid();
  uVar1 = cfd::core::OutPoint::GetVout();
  uVar2 = cfd::core::Psbt::AddTxIn(in_RDI,(uint)local_38,uVar1);
  core::Txid::~Txid((Txid *)0x3c3862);
  return uVar2;
}

Assistant:

uint32_t Psbt::AddTxIn(const OutPoint& outpoint, uint32_t sequence) {
  return cfd::core::Psbt::AddTxIn(
      outpoint.GetTxid(), outpoint.GetVout(), sequence);
}